

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  int iVar1;
  int iVar2;
  huffman_tree_node *phVar3;
  int iVar4;
  char *fmt;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  uint local_58;
  uint local_54;
  
  code->numentries = 0;
  code->numallocatedentries = 0;
  iVar1 = new_node(code);
  if (iVar1 < 0) {
LAB_00152551:
    fmt = "Unable to allocate memory for node data.";
    iVar1 = 0xc;
LAB_00152556:
    archive_set_error(&a->archive,iVar1,fmt);
    iVar4 = -0x1e;
  }
  else {
    code->numentries = 1;
    code->minlength = 0x7fffffff;
    code->maxlength = -0x80000000;
    local_58 = 1;
    uVar5 = 0;
    local_54 = 2;
    iVar1 = numsymbols;
    do {
      if (0 < numsymbols) {
        uVar7 = 0;
        do {
          if (local_58 == lengths[uVar7]) {
            free(code->table);
            code->table = (huffman_table_entry *)0x0;
            if (code->maxlength < (int)local_58) {
              code->maxlength = local_58;
            }
            if ((int)local_58 < code->minlength) {
              code->minlength = local_58;
            }
            phVar3 = code->tree;
            iVar4 = 0;
            uVar6 = local_54;
            do {
              if (phVar3[iVar4].branches[0] == phVar3[iVar4].branches[1]) goto LAB_00152526;
              bVar8 = (uVar5 >> (uVar6 - 2 & 0x1f) & 1) != 0;
              iVar2 = phVar3[iVar4].branches[bVar8];
              if (phVar3[iVar4].branches[bVar8] < 0) {
                iVar2 = new_node(code);
                if (iVar2 < 0) goto LAB_00152551;
                iVar2 = code->numentries;
                code->numentries = iVar2 + 1;
                phVar3 = code->tree;
                phVar3[iVar4].branches[bVar8] = iVar2;
              }
              iVar4 = iVar2;
              uVar6 = uVar6 - 1;
            } while (1 < uVar6);
            if ((phVar3[iVar4].branches[0] != -1) || (phVar3[iVar4].branches[1] != -2)) {
LAB_00152526:
              fmt = "Prefix found";
              iVar1 = 0x54;
              goto LAB_00152556;
            }
            phVar3[iVar4].branches[0] = (int)uVar7;
            phVar3[iVar4].branches[1] = (int)uVar7;
            if (iVar1 < 2) {
              return 0;
            }
            uVar5 = uVar5 + 1;
            iVar1 = iVar1 + -1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)numsymbols);
      }
      iVar4 = 0;
      if (iVar1 < 1) {
        return 0;
      }
      uVar5 = uVar5 * 2;
      local_58 = local_58 + 1;
      local_54 = local_54 + 1;
    } while (local_58 != 0x10);
  }
  return iVar4;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  code->numentries = 0;
  code->numallocatedentries = 0;
  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0)
        break;
    }
    if (symbolsleft <= 0)
      break;
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}